

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3GetUInt32(char *z,u32 *pI)

{
  int i;
  u64 v;
  u32 *pI_local;
  char *z_local;
  int local_4;
  
  v = 0;
  i = 0;
  while( true ) {
    if ((""[(byte)z[i]] & 4) == 0) {
      if ((i == 0) || (z[i] != '\0')) {
        *pI = 0;
        local_4 = 0;
      }
      else {
        *pI = (u32)v;
        local_4 = 1;
      }
      return local_4;
    }
    v = (v * 10 + (long)z[i]) - 0x30;
    if (0x100000000 < v) break;
    i = i + 1;
  }
  *pI = 0;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3GetUInt32(const char *z, u32 *pI){
  u64 v = 0;
  int i;
  for(i=0; sqlite3Isdigit(z[i]); i++){
    v = v*10 + z[i] - '0';
    if( v>4294967296LL ){ *pI = 0; return 0; }
  }
  if( i==0 || z[i]!=0 ){ *pI = 0; return 0; }
  *pI = (u32)v;
  return 1;
}